

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O2

void __thiscall Hes_Apu::end_frame(Hes_Apu *this,blip_time_t end_time)

{
  int iVar1;
  long lVar2;
  Hes_Osc *this_00;
  
  this_00 = this->oscs + 5;
  lVar2 = -0x2a0;
  do {
    iVar1 = this_00->last_time;
    if (iVar1 < end_time) {
      Hes_Osc::run_until(this_00,&this->synth,end_time);
      iVar1 = this_00->last_time;
    }
    this_00->last_time = iVar1 - end_time;
    this_00 = this_00 + -1;
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0);
  return;
}

Assistant:

void Hes_Apu::end_frame( blip_time_t end_time )
{
	Hes_Osc* osc = &oscs [osc_count];
	do
	{
		osc--;
		if ( end_time > osc->last_time )
			osc->run_until( synth, end_time );
		assert( osc->last_time >= end_time );
		osc->last_time -= end_time;
	}
	while ( osc != oscs );
}